

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::EnumValueDescriptorProto::IsInitialized(EnumValueDescriptorProto *this)

{
  uint uVar1;
  EnumValueOptions *pEVar2;
  bool bVar3;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if (((uVar1 & 2) != 0) && (this->options_ == (EnumValueOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.h"
               ,0x2687);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((uVar1 & 2) == 0) {
LAB_002a1c33:
    bVar3 = true;
  }
  else {
    pEVar2 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pEVar2->_extensions_);
    if (bVar3) {
      bVar3 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                        (&pEVar2->uninterpreted_option_);
      if (bVar3) goto LAB_002a1c33;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EnumValueDescriptorProto::IsInitialized() const {
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}